

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  int *piVar1;
  Status *this_00;
  undefined8 *in_RCX;
  size_t in_RDX;
  long in_RSI;
  Status *in_RDI;
  string *in_R8;
  ssize_t read_size;
  Status *status;
  Status *in_stack_ffffffffffffff88;
  Slice local_50;
  size_t local_38;
  uint3 in_stack_ffffffffffffffd4;
  uint error_number;
  
  error_number = (uint)in_stack_ffffffffffffffd4;
  Status::Status(in_RDI);
  do {
    local_38 = read(*(int *)(in_RSI + 8),in_R8,in_RDX);
    if (-1 < (long)local_38) {
      Slice::Slice(&local_50,(char *)in_R8,local_38);
      *in_RCX = local_50.data_;
      in_RCX[1] = local_50.size_;
      return (Status)(char *)in_RDI;
    }
    piVar1 = __errno_location();
  } while (*piVar1 == 4);
  this_00 = (Status *)(in_RSI + 0x10);
  __errno_location();
  PosixError(in_R8,error_number);
  Status::operator=(this_00,in_stack_ffffffffffffff88);
  Status::~Status(this_00);
  return (Status)(char *)in_RDI;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }